

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O0

ngx_int_t ngx_ext_rename_file(ngx_str_t *src,ngx_str_t *to,ngx_ext_rename_file_t *ext)

{
  ngx_log_t *pnVar1;
  size_t sVar2;
  u_char *puVar3;
  int iVar4;
  int *piVar5;
  ngx_int_t nVar6;
  u_char *buf;
  ngx_atomic_uint_t nVar7;
  undefined1 local_60 [8];
  ngx_copy_file_t cf;
  ngx_err_t err;
  u_char *name;
  ngx_ext_rename_file_t *ext_local;
  ngx_str_t *to_local;
  ngx_str_t *src_local;
  
  if ((ext->access == 0) || (iVar4 = chmod((char *)src->data,(__mode_t)ext->access), iVar4 != -1)) {
    if ((ext->time == -1) || (nVar6 = ngx_set_file_time(src->data,ext->fd,ext->time), nVar6 == 0)) {
      iVar4 = rename((char *)src->data,(char *)to->data);
      if (iVar4 != -1) {
        return 0;
      }
      piVar5 = __errno_location();
      cf.log._4_4_ = *piVar5;
      if (cf.log._4_4_ == 2) {
        if ((ext->field_0x1c & 1) == 0) goto LAB_00123be4;
        cf.log._4_4_ = ngx_create_full_path
                                 (to->data,ext->path_access | (ext->path_access & 0x124) >> 2);
        if (cf.log._4_4_ != 0) {
          if (2 < ext->log->log_level) {
            ngx_log_error_core(3,ext->log,cf.log._4_4_,"mkdir() \"%s\" failed",to->data);
          }
          cf.log._4_4_ = 0;
          goto LAB_00123be4;
        }
        iVar4 = rename((char *)src->data,(char *)to->data);
        if (iVar4 != -1) {
          return 0;
        }
        piVar5 = __errno_location();
        cf.log._4_4_ = *piVar5;
      }
      if (cf.log._4_4_ == 0x12) {
        local_60 = (undefined1  [8])0xffffffffffffffff;
        cf.size = 0;
        cf.buf_size = ext->access;
        cf.access = ext->time;
        cf.time = (time_t)ext->log;
        buf = (u_char *)ngx_alloc(to->len + 0xc,ext->log);
        if (buf == (u_char *)0x0) {
          return -1;
        }
        sVar2 = to->len;
        puVar3 = to->data;
        nVar7 = ngx_next_temp_number(0);
        ngx_sprintf(buf,"%*s.%010uD%Z",sVar2,puVar3,nVar7 & 0xffffffff);
        nVar6 = ngx_copy_file(src->data,buf,(ngx_copy_file_t *)local_60);
        if (nVar6 == 0) {
          iVar4 = rename((char *)buf,(char *)to->data);
          if (iVar4 != -1) {
            free(buf);
            iVar4 = unlink((char *)src->data);
            if (iVar4 == -1) {
              if (2 < ext->log->log_level) {
                pnVar1 = ext->log;
                piVar5 = __errno_location();
                ngx_log_error_core(3,pnVar1,*piVar5,"unlink() \"%s\" failed",src->data);
              }
              return -1;
            }
            return 0;
          }
          if (2 < ext->log->log_level) {
            pnVar1 = ext->log;
            piVar5 = __errno_location();
            ngx_log_error_core(3,pnVar1,*piVar5,"rename() \"%s\" to \"%s\" failed",buf,to->data);
          }
          iVar4 = unlink((char *)buf);
          if ((iVar4 == -1) && (2 < ext->log->log_level)) {
            pnVar1 = ext->log;
            piVar5 = __errno_location();
            ngx_log_error_core(3,pnVar1,*piVar5,"unlink() \"%s\" failed",buf);
          }
        }
        free(buf);
        cf.log._4_4_ = 0;
      }
    }
    else {
      if (2 < ext->log->log_level) {
        pnVar1 = ext->log;
        piVar5 = __errno_location();
        ngx_log_error_core(3,pnVar1,*piVar5,"utimes() \"%s\" failed",src->data);
      }
      cf.log._4_4_ = 0;
    }
  }
  else {
    if (2 < ext->log->log_level) {
      pnVar1 = ext->log;
      piVar5 = __errno_location();
      ngx_log_error_core(3,pnVar1,*piVar5,"chmod() \"%s\" failed",src->data);
    }
    cf.log._4_4_ = 0;
  }
LAB_00123be4:
  if (((((byte)ext->field_0x1c >> 1 & 1) != 0) && (iVar4 = unlink((char *)src->data), iVar4 == -1))
     && (2 < ext->log->log_level)) {
    pnVar1 = ext->log;
    piVar5 = __errno_location();
    ngx_log_error_core(3,pnVar1,*piVar5,"unlink() \"%s\" failed",src->data);
  }
  if ((cf.log._4_4_ != 0) && (2 < ext->log->log_level)) {
    ngx_log_error_core(3,ext->log,cf.log._4_4_,"rename() \"%s\" to \"%s\" failed",src->data,to->data
                      );
  }
  return -1;
}

Assistant:

ngx_int_t
ngx_ext_rename_file(ngx_str_t *src, ngx_str_t *to, ngx_ext_rename_file_t *ext)
{
    u_char           *name;
    ngx_err_t         err;
    ngx_copy_file_t   cf;

#if !(NGX_WIN32)

    if (ext->access) {
        if (ngx_change_file_access(src->data, ext->access) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_CRIT, ext->log, ngx_errno,
                          ngx_change_file_access_n " \"%s\" failed", src->data);
            err = 0;
            goto failed;
        }
    }

#endif

    if (ext->time != -1) {
        if (ngx_set_file_time(src->data, ext->fd, ext->time) != NGX_OK) {
            ngx_log_error(NGX_LOG_CRIT, ext->log, ngx_errno,
                          ngx_set_file_time_n " \"%s\" failed", src->data);
            err = 0;
            goto failed;
        }
    }

    if (ngx_rename_file(src->data, to->data) != NGX_FILE_ERROR) {
        return NGX_OK;
    }

    err = ngx_errno;

    if (err == NGX_ENOPATH) {

        if (!ext->create_path) {
            goto failed;
        }

        err = ngx_create_full_path(to->data, ngx_dir_access(ext->path_access));

        if (err) {
            ngx_log_error(NGX_LOG_CRIT, ext->log, err,
                          ngx_create_dir_n " \"%s\" failed", to->data);
            err = 0;
            goto failed;
        }

        if (ngx_rename_file(src->data, to->data) != NGX_FILE_ERROR) {
            return NGX_OK;
        }

        err = ngx_errno;
    }

#if (NGX_WIN32)

    if (err == NGX_EEXIST || err == NGX_EEXIST_FILE) {
        err = ngx_win32_rename_file(src, to, ext->log);

        if (err == 0) {
            return NGX_OK;
        }
    }

#endif

    if (err == NGX_EXDEV) {

        cf.size = -1;
        cf.buf_size = 0;
        cf.access = ext->access;
        cf.time = ext->time;
        cf.log = ext->log;

        name = ngx_alloc(to->len + 1 + 10 + 1, ext->log);
        if (name == NULL) {
            return NGX_ERROR;
        }

        (void) ngx_sprintf(name, "%*s.%010uD%Z", to->len, to->data,
                           (uint32_t) ngx_next_temp_number(0));

        if (ngx_copy_file(src->data, name, &cf) == NGX_OK) {

            if (ngx_rename_file(name, to->data) != NGX_FILE_ERROR) {
                ngx_free(name);

                if (ngx_delete_file(src->data) == NGX_FILE_ERROR) {
                    ngx_log_error(NGX_LOG_CRIT, ext->log, ngx_errno,
                                  ngx_delete_file_n " \"%s\" failed",
                                  src->data);
                    return NGX_ERROR;
                }

                return NGX_OK;
            }

            ngx_log_error(NGX_LOG_CRIT, ext->log, ngx_errno,
                          ngx_rename_file_n " \"%s\" to \"%s\" failed",
                          name, to->data);

            if (ngx_delete_file(name) == NGX_FILE_ERROR) {
                ngx_log_error(NGX_LOG_CRIT, ext->log, ngx_errno,
                              ngx_delete_file_n " \"%s\" failed", name);

            }
        }

        ngx_free(name);

        err = 0;
    }

failed:

    if (ext->delete_file) {
        if (ngx_delete_file(src->data) == NGX_FILE_ERROR) {
            ngx_log_error(NGX_LOG_CRIT, ext->log, ngx_errno,
                          ngx_delete_file_n " \"%s\" failed", src->data);
        }
    }

    if (err) {
        ngx_log_error(NGX_LOG_CRIT, ext->log, err,
                      ngx_rename_file_n " \"%s\" to \"%s\" failed",
                      src->data, to->data);
    }

    return NGX_ERROR;
}